

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall VmaDedicatedAllocationList::Validate(VmaDedicatedAllocationList *this)

{
  DedicatedAllocationLinkedList *pDVar1;
  size_t sVar2;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_18;
  
  sVar2 = (this->m_AllocationList).m_Count;
  local_18.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_18.m_pMutex = &this->m_Mutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  for (pDVar1 = &this->m_AllocationList; pDVar1->m_Front != (ItemType *)0x0;
      pDVar1 = (DedicatedAllocationLinkedList *)((long)&pDVar1->m_Front->field_0 + 0x20)) {
    sVar2 = sVar2 - 1;
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_18);
  return sVar2 == 0;
}

Assistant:

bool VmaDedicatedAllocationList::Validate()
{
    const size_t declaredCount = m_AllocationList.GetCount();
    size_t actualCount = 0;
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        ++actualCount;
    }
    VMA_VALIDATE(actualCount == declaredCount);

    return true;
}